

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginTabItem(char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  short sVar1;
  ImGuiTabBar *tab_bar;
  bool bVar2;
  
  if (GImGui->CurrentWindow->SkipItems == false) {
    tab_bar = GImGui->CurrentTabBar;
    if (tab_bar == (ImGuiTabBar *)0x0) {
      __assert_fail("(tab_bar) && \"Needs to be called between BeginTabBar() and EndTabBar()!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                    ,0x1df3,"bool ImGui::BeginTabItem(const char *, bool *, ImGuiTabItemFlags)");
    }
    if (((uint)flags >> 0x15 & 1) != 0) {
      __assert_fail("!(flags & ImGuiTabItemFlags_Button)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                    ,0x1df6,"bool ImGui::BeginTabItem(const char *, bool *, ImGuiTabItemFlags)");
    }
    bVar2 = TabItemEx(tab_bar,label,p_open,flags);
    if ((char)((flags & 8U) >> 3) == '\0' && bVar2) {
      sVar1 = tab_bar->LastTabItemIdx;
      if ((sVar1 < 0) || ((tab_bar->Tabs).Size <= (int)sVar1)) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                      ,0x68b,"T &ImVector<ImGuiTabItem>::operator[](int) [T = ImGuiTabItem]");
      }
      PushOverrideID((tab_bar->Tabs).Data[(uint)(int)sVar1].ID);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool    ImGui::BeginTabItem(const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    ImGuiTabBar* tab_bar = g.CurrentTabBar;
    if (tab_bar == NULL)
    {
        IM_ASSERT_USER_ERROR(tab_bar, "Needs to be called between BeginTabBar() and EndTabBar()!");
        return false;
    }
    IM_ASSERT(!(flags & ImGuiTabItemFlags_Button)); // BeginTabItem() Can't be used with button flags, use TabItemButton() instead!

    bool ret = TabItemEx(tab_bar, label, p_open, flags);
    if (ret && !(flags & ImGuiTabItemFlags_NoPushId))
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_bar->LastTabItemIdx];
        PushOverrideID(tab->ID); // We already hashed 'label' so push into the ID stack directly instead of doing another hash through PushID(label)
    }
    return ret;
}